

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double multinomial_pdf(int *x,int a,int b,double *c)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double local_38;
  double pdf_log;
  double pdf;
  int i;
  double *c_local;
  int b_local;
  int a_local;
  int *x_local;
  
  local_38 = lgamma((double)(a + 1));
  for (pdf._4_4_ = 0; pdf._4_4_ < b; pdf._4_4_ = pdf._4_4_ + 1) {
    iVar1 = x[pdf._4_4_];
    dVar2 = log(c[pdf._4_4_]);
    dVar3 = lgamma((double)(x[pdf._4_4_] + 1));
    local_38 = ((double)iVar1 * dVar2 + local_38) - dVar3;
  }
  dVar2 = exp(local_38);
  return dVar2;
}

Assistant:

double multinomial_pdf ( int x[], int a, int b, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    MULTINOMIAL_PDF computes a Multinomial PDF.
//
//  Discussion:
//
//    PDF(A,B,C;X) = Comb(A,B,X) * Product ( 1 <= I <= B ) C(I)^X(I)
//
//    where Comb(A,B,X) is the multinomial coefficient
//      C( A; X(1), X(2), ..., X(B) )
//
//    PDF(A,B,C;X) is the probability that in A trials there
//    will be exactly X(I) occurrences of event I, whose probability
//    on one trial is C(I), for I from 1 to B.
//
//    As soon as A or B gets large, the number of possible X's explodes,
//    and the probability of any particular X can become extremely small.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X[B]; X(I) counts the number of occurrences of
//    outcome I, out of the total of A trials.
//
//    Input, int A, the total number of trials.
//
//    Input, int B, the number of different possible outcomes on
//    one trial.
//
//    Input, double C[B]; C(I) is the probability of outcome I on
//    any one trial.
//
//    Output, double MULTINOMIAL_PDF, the value of the multinomial PDF.
//
{
  int i;
  double pdf;
  double pdf_log;
//
//  To try to avoid overflow, do the calculation in terms of logarithms.
//  Note that Gamma(A+1) = A factorial.
//
  pdf_log = lgamma ( static_cast<double>(a + 1 ) );

  for ( i = 0; i < b; i++ )
  {
    pdf_log = pdf_log + x[i] * log ( c[i] )
      - lgamma ( static_cast< double >( x[i] + 1 ) );
  }

  pdf = exp ( pdf_log );

  return pdf;
}